

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASEParser.cpp
# Opt level: O2

void __thiscall
Assimp::ASE::Parser::ParseLV3MeshCListBlock(Parser *this,uint iNumVertices,Mesh *mesh)

{
  pointer paVar1;
  bool bVar2;
  byte *pbVar3;
  byte bVar4;
  int local_50;
  uint iIndex;
  vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *local_48;
  undefined8 local_40;
  undefined8 uStack_38;
  
  local_48 = &mesh->mVertexColors;
  std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::resize
            (local_48,(ulong)iNumVertices);
  local_50 = 0;
  do {
    while( true ) {
      pbVar3 = (byte *)this->filePtr;
      bVar4 = *pbVar3;
      if (bVar4 != 0x2a) break;
      this->filePtr = (char *)(pbVar3 + 1);
      bVar2 = TokenMatch<char_const>(&this->filePtr,"MESH_VERTCOL",0xc);
      if (!bVar2) {
        pbVar3 = (byte *)this->filePtr;
        bVar4 = *pbVar3;
        break;
      }
      uStack_38 = 0x3f80000000000000;
      local_40 = 0;
      ParseLV4MeshFloatTriple(this,(ai_real *)&local_40,&iIndex);
      if (iIndex < iNumVertices) {
        paVar1 = (local_48->super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + iIndex;
        paVar1->r = (float)(undefined4)local_40;
        paVar1->g = (float)local_40._4_4_;
        paVar1->b = (float)(undefined4)uStack_38;
        paVar1->a = (float)uStack_38._4_4_;
      }
      else {
        LogWarning(this,"Vertex color has an invalid index. It will be ignored");
      }
    }
    if ((bVar4 - 0xc < 2) || (bVar4 == 10)) {
      if (this->bLastWasEndLine != false) goto LAB_003e21f1;
      this->iLineNumber = this->iLineNumber + 1;
      bVar2 = true;
    }
    else {
      if (bVar4 == 0x7b) {
        local_50 = local_50 + 1;
      }
      else if (bVar4 == 0x7d) {
        local_50 = local_50 + -1;
        if (local_50 == 0) {
          this->filePtr = (char *)(pbVar3 + 1);
          SkipToNextToken(this);
          return;
        }
      }
      else if (bVar4 == 0) {
        LogError(this,
                 "Encountered unexpected EOL while parsing a *MESH_CVERTEX_LIST chunk (Level 3)");
      }
LAB_003e21f1:
      bVar2 = false;
    }
    this->bLastWasEndLine = bVar2;
    this->filePtr = (char *)(pbVar3 + 1);
  } while( true );
}

Assistant:

void Parser::ParseLV3MeshCListBlock(unsigned int iNumVertices, ASE::Mesh& mesh)
{
    AI_ASE_PARSER_INIT();

    // allocate enough storage in the array
    mesh.mVertexColors.resize(iNumVertices);
    while (true)
    {
        if ('*' == *filePtr)
        {
            ++filePtr;

            // Vertex entry
            if (TokenMatch(filePtr,"MESH_VERTCOL" ,12))
            {
                aiColor4D vTemp;
                vTemp.a = 1.0f;
                unsigned int iIndex;
                ParseLV4MeshFloatTriple(&vTemp.r,iIndex);

                if (iIndex >= iNumVertices)
                {
                    LogWarning("Vertex color has an invalid index. It will be ignored");
                }
                else mesh.mVertexColors[iIndex] = vTemp;
                continue;
            }
        }
        AI_ASE_HANDLE_SECTION("3","*MESH_CVERTEX_LIST");
    }
    return;
}